

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

char * lyd_get_unique_default(char *unique_expr,lyd_node *list)

{
  long lVar1;
  int iVar2;
  LY_ERR *pLVar3;
  ly_set *set;
  ly_set *set_00;
  uint local_64;
  uint i;
  ly_set *r;
  ly_set *s;
  char *dflt;
  lyd_node *node;
  lyd_node *last;
  lys_tpdf *tpdf;
  lys_node_leaf *sleaf;
  lys_node *parent;
  lyd_node *list_local;
  char *unique_expr_local;
  
  tpdf = (lys_tpdf *)0x0;
  s = (ly_set *)0x0;
  parent = (lys_node *)list;
  list_local = (lyd_node *)unique_expr;
  if (unique_expr == (char *)0x0) {
    __assert_fail("unique_expr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                  ,0x1366,"const char *lyd_get_unique_default(const char *, struct lyd_node *)");
  }
  iVar2 = resolve_descendant_schema_nodeid
                    (unique_expr,list->schema->child,4,1,1,(lys_node **)&sleaf);
  if ((iVar2 == 0) && (sleaf != (lys_node_leaf *)0x0)) {
    tpdf = (lys_tpdf *)sleaf;
    if (sleaf->dflt == (char *)0x0) {
      if ((sleaf->flags & 0x40) == 0) {
        for (last = (lyd_node *)(sleaf->type).der; last != (lyd_node *)0x0 && s == (ly_set *)0x0;
            last = last[1].next) {
          s = *(ly_set **)&last[2].validity;
        }
      }
    }
    else {
      s = (ly_set *)sleaf->dflt;
    }
    if (s == (ly_set *)0x0) {
      unique_expr_local = (char *)0x0;
    }
    else {
      set = ly_set_new();
      for (sleaf = (lys_node_leaf *)lys_parent((lys_node *)tpdf);
          sleaf != (lys_node_leaf *)parent->name;
          sleaf = (lys_node_leaf *)lys_parent((lys_node *)sleaf)) {
        if ((sleaf->nodetype & (LYS_USES|LYS_CASE|LYS_CHOICE|LYS_CONTAINER)) == LYS_UNKNOWN) {
          pLVar3 = ly_errno_location();
          *pLVar3 = LY_EINT;
          ly_log(LY_LLERR,"Internal error (%s:%d).",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                 ,0x1382);
          ly_set_free(set);
          return (char *)0x0;
        }
        ly_set_add(set,sleaf,1);
      }
      ly_vlog_hide('\x01');
      node = (lyd_node *)parent;
      for (local_64 = 0; local_64 < set->number; local_64 = local_64 + 1) {
        sleaf = (lys_node_leaf *)(set->set).s[local_64];
        if (sleaf->nodetype == LYS_CONTAINER) {
          if (node != (lyd_node *)0x0) {
            set_00 = lyd_find_xpath(node,sleaf->name);
            if ((set_00 == (ly_set *)0x0) || (1 < set_00->number)) {
              ly_set_free(set_00);
              pLVar3 = ly_errno_location();
              *pLVar3 = LY_EINT;
              ly_log(LY_LLERR,"Internal error (%s:%d).",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                     ,0x1393);
              s = (ly_set *)0x0;
              break;
            }
            if (set_00->number == 0) {
              node = (lyd_node *)0x0;
            }
            else {
              node = *(set_00->set).d;
            }
            ly_set_free(set_00);
          }
          lVar1._0_4_ = (sleaf->type).base;
          lVar1._4_1_ = (sleaf->type).ext_size;
          lVar1._5_3_ = *(undefined3 *)&(sleaf->type).field_0xd;
          if (lVar1 != 0) {
            s = (ly_set *)0x0;
            break;
          }
        }
        else if ((sleaf->nodetype == LYS_CHOICE) && (node != (lyd_node *)0x0)) {
          if (local_64 + 1 == set->number) {
            sleaf = (lys_node_leaf *)tpdf;
          }
          else {
            if ((((set->set).s[local_64 + 1]->nodetype == LYS_CASE) && (local_64 + 2 < set->number))
               && ((set->set).s[local_64 + 2]->nodetype == LYS_CHOICE)) {
              local_64 = local_64 + 1;
              goto LAB_0018fb90;
            }
            sleaf = (lys_node_leaf *)(set->set).s[local_64 + 1];
          }
          dflt = (char *)node->child;
          iVar2 = lyv_multicases((lyd_node *)0x0,(lys_node *)sleaf,(lyd_node **)&dflt,0,
                                 (lyd_node *)0x0);
          if (iVar2 != 0) {
            ly_err_clean(1);
            s = (ly_set *)0x0;
            break;
          }
        }
LAB_0018fb90:
      }
      ly_vlog_hide('\0');
      ly_set_free(set);
      unique_expr_local = (char *)s;
    }
  }
  else {
    pLVar3 = ly_errno_location();
    *pLVar3 = LY_EINT;
    ly_log(LY_LLERR,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
           ,0x136a);
    unique_expr_local = (char *)0x0;
  }
  return unique_expr_local;
}

Assistant:

const char *
lyd_get_unique_default(const char* unique_expr, struct lyd_node *list)
{
    const struct lys_node *parent;
    const struct lys_node_leaf *sleaf = NULL;
    struct lys_tpdf *tpdf;
    struct lyd_node *last, *node;
    const char *dflt = NULL;
    struct ly_set *s, *r;
    unsigned int i;

    assert(unique_expr);

    if (resolve_descendant_schema_nodeid(unique_expr, list->schema->child, LYS_LEAF, 1, 1, &parent) || !parent) {
        /* error, but unique expression was checked when the schema was parsed so this should not happened */
        LOGINT;
        return NULL;
    }

    sleaf = (struct lys_node_leaf *)parent;
    if (sleaf->dflt) {
        /* leaf has a default value */
        dflt = sleaf->dflt;
    } else if (!(sleaf->flags & LYS_MAND_TRUE)) {
        /* get the default value from the type */
        for (tpdf = sleaf->type.der; tpdf && !dflt; tpdf = tpdf->type.der) {
            dflt = tpdf->dflt;
        }
    }

    if (!dflt) {
        return NULL;
    }

    /* it has default value, but check if it can appear in the data tree under the list */
    s = ly_set_new();
    for (parent = lys_parent((struct lys_node *)sleaf); parent != list->schema; parent = lys_parent(parent)) {
        if (!(parent->nodetype & (LYS_CONTAINER | LYS_CASE | LYS_CHOICE | LYS_USES))) {
            /* This should be already detected when parsing schema */
            LOGINT;
            ly_set_free(s);
            return NULL;
        }
        ly_set_add(s, (void *)parent, LY_SET_OPT_USEASLIST);
    }
    ly_vlog_hide(1);
    for (i = 0, last = list; i < s->number; i++) {
        parent = s->set.s[i]; /* shortcut */

        switch (parent->nodetype) {
        case LYS_CONTAINER:
            if (last) {
                /* find instance in the data */
                r = lyd_find_xpath(last, parent->name);
                if (!r || r->number > 1) {
                    ly_set_free(r);
                    LOGINT;
                    dflt = NULL;
                    goto end;
                }
                if (r->number) {
                    last = r->set.d[0];
                } else {
                    last = NULL;
                }
                ly_set_free(r);
            }
            if (((struct lys_node_container *)parent)->presence) {
                /* not-instantiated presence container on path */
                dflt = NULL;
                goto end;
            }
            break;
        case LYS_CHOICE :
            /* check presence of another case */
            if (!last) {
                continue;
            }

            /* remember the case to be searched in choice by lyv_multicases() */
            if (i + 1 == s->number) {
                parent = (struct lys_node *)sleaf;
            } else if (s->set.s[i + 1]->nodetype == LYS_CASE && (i + 2 < s->number) &&
                    s->set.s[i + 2]->nodetype == LYS_CHOICE) {
                /* nested choices are covered by lyv_multicases, we just have to pass
                 * the lowest choice */
                i++;
                continue;
            } else {
                parent = s->set.s[i + 1];
            }
            node = last->child;
            if (lyv_multicases(NULL, (struct lys_node *)parent, &node, 0, NULL)) {
                /* another case is present */
                ly_err_clean(1);
                dflt = NULL;
                goto end;
            }
            break;
        default:
            /* LYS_CASE, LYS_USES */
            continue;
        }
    }

end:
    ly_vlog_hide(0);
    ly_set_free(s);
    return dflt;
}